

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O2

UINT8 __thiscall
VGMPlayer::GetSongDeviceInfo
          (VGMPlayer *this,vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_> *devInfList)

{
  pointer pPVar1;
  pointer pSVar2;
  ulong uVar3;
  pointer pCVar4;
  DEV_DEF *pDVar5;
  UINT16 UVar6;
  UINT32 UVar7;
  ulong uVar8;
  long lVar9;
  value_type local_48;
  
  if (this->_dLoad != (DATA_LOADER *)0x0) {
    pPVar1 = (devInfList->super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((devInfList->super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>)._M_impl.
        super__Vector_impl_data._M_finish != pPVar1) {
      (devInfList->super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>)._M_impl.
      super__Vector_impl_data._M_finish = pPVar1;
    }
    std::vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>::reserve
              (devInfList,
               ((long)(this->_devCfgs).
                      super__Vector_base<VGMPlayer::SONG_DEV_CFG,_std::allocator<VGMPlayer::SONG_DEV_CFG>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->_devCfgs).
                     super__Vector_base<VGMPlayer::SONG_DEV_CFG,_std::allocator<VGMPlayer::SONG_DEV_CFG>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x28);
    lVar9 = 0;
    uVar8 = 0;
    while( true ) {
      pSVar2 = (this->_devCfgs).
               super__Vector_base<VGMPlayer::SONG_DEV_CFG,_std::allocator<VGMPlayer::SONG_DEV_CFG>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->_devCfgs).
                         super__Vector_base<VGMPlayer::SONG_DEV_CFG,_std::allocator<VGMPlayer::SONG_DEV_CFG>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2) / 0x28) <= uVar8
         ) break;
      uVar3 = *(ulong *)((long)&pSVar2->deviceID + lVar9);
      local_48.devCfg =
           *(DEV_GEN_CFG **)
            ((long)&(pSVar2->cfgData).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl +
            lVar9);
      pCVar4 = (this->_devices).
               super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_48.core = 0;
      local_48.smplRate = 0;
      local_48.type = (&pSVar2->type)[lVar9];
      local_48.id = *(undefined4 *)((long)&pSVar2->deviceID + lVar9);
      local_48.instance = (&pSVar2->instance)[lVar9];
      local_48.volume = 0;
      if ((pCVar4 == (pointer)0x0) ||
         ((ulong)(((long)(this->_devices).
                         super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar4) / 0xf0) <= uVar3
         )) {
        UVar7 = 0;
        UVar6 = GetChipVolume(this,(&pSVar2->vgmChipType)[lVar9],(&pSVar2->instance)[lVar9],'\0');
        local_48.volume = UVar6;
      }
      else {
        pDVar5 = pCVar4[uVar3].base.defInf.devDef;
        if (pDVar5 == (DEV_DEF *)0x0) {
          local_48.core = 0;
        }
        else {
          local_48.core = pDVar5->coreID;
        }
        local_48.smplRate = 0;
        local_48.volume =
             (UINT16)(((int)pCVar4[uVar3].base.resmpl.volumeR +
                      (int)pCVar4[uVar3].base.resmpl.volumeL) / 2);
        UVar7 = pCVar4[uVar3].base.defInf.sampleRate;
      }
      local_48.smplRate = UVar7;
      std::vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>::push_back(devInfList,&local_48);
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 0x28;
    }
    return this->_playState & 1;
  }
  return 0xff;
}

Assistant:

UINT8 VGMPlayer::GetSongDeviceInfo(std::vector<PLR_DEV_INFO>& devInfList) const
{
	if (_dLoad == NULL)
		return 0xFF;
	
	size_t curDev;
	
	devInfList.clear();
	devInfList.reserve(_devCfgs.size());
	for (curDev = 0; curDev < _devCfgs.size(); curDev ++)
	{
		const SONG_DEV_CFG& sdCfg = _devCfgs[curDev];
		const DEV_GEN_CFG* dCfg = (const DEV_GEN_CFG*)&sdCfg.cfgData[0];
		const CHIP_DEVICE* cDev = (sdCfg.deviceID < _devices.size()) ? &_devices[sdCfg.deviceID] : NULL;
		PLR_DEV_INFO devInf;
		
		// chip configuration from VGM header
		memset(&devInf, 0x00, sizeof(PLR_DEV_INFO));
		devInf.type = sdCfg.type;
		devInf.id = (UINT32)sdCfg.deviceID;
		devInf.instance = (UINT8)sdCfg.instance;
		devInf.devCfg = dCfg;
		if (cDev != NULL)
		{
			// when playing, get information from device structures (may feature modified volume levels)
			const VGM_BASEDEV* clDev = &cDev->base;
			devInf.core = (clDev->defInf.devDef != NULL) ? clDev->defInf.devDef->coreID : 0x00;
			devInf.volume = (clDev->resmpl.volumeL + clDev->resmpl.volumeR) / 2;
			devInf.smplRate = clDev->defInf.sampleRate;
		}
		else
		{
			devInf.core = 0x00;
			devInf.volume = GetChipVolume(sdCfg.vgmChipType, sdCfg.instance, 0);
			devInf.smplRate = 0;
		}
		devInfList.push_back(devInf);
	}
	if (_playState & PLAYSTATE_PLAY)
		return 0x01;	// returned "live" data
	else
		return 0x00;	// returned data based on file header
}